

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O2

int __thiscall HighsNodeQueue::link(HighsNodeQueue *this,char *__from,char *__to)

{
  double dVar1;
  pointer pOVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  
  pOVar2 = (this->nodes).
           super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar1 = pOVar2[(long)__from].lower_bound;
  if (this->optimality_limit <= dVar1 && dVar1 != this->optimality_limit) {
    pOVar2[(long)__from].estimate = INFINITY;
    link_suboptimal(this,(int64_t)__from);
    link_domchgs(this,(int64_t)__from);
    ldexp(1.0,1 - (this->nodes).
                  super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)__from].depth);
    return extraout_EAX;
  }
  link_estim(this,(int64_t)__from);
  link_lower(this,(int64_t)__from);
  link_domchgs(this,(int64_t)__from);
  return extraout_EAX_00;
}

Assistant:

double HighsNodeQueue::link(int64_t node) {
  if (nodes[node].lower_bound > optimality_limit) {
    assert(nodes[node].estimate != kHighsInf);
    nodes[node].estimate = kHighsInf;
    link_suboptimal(node);
    link_domchgs(node);
    return std::ldexp(1.0, 1 - nodes[node].depth);
  }

  link_estim(node);
  link_lower(node);
  link_domchgs(node);
  return 0.0;
}